

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O3

int N_VScaleVectorArray_Serial(int nvec,realtype *c,N_Vector *X,N_Vector *Z)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (nvec < 1) {
    return -1;
  }
  if (nvec == 1) {
    N_VScale_Serial(*c,*X,*Z);
  }
  else {
    uVar1 = *(*Z)->content;
    if (X == Z) {
      uVar4 = 0;
      do {
        if (0 < (int)uVar1) {
          lVar2 = *(long *)((long)X[uVar4]->content + 8);
          uVar5 = 0;
          do {
            *(double *)(lVar2 + uVar5 * 8) = c[uVar4] * *(double *)(lVar2 + uVar5 * 8);
            uVar5 = uVar5 + 1;
          } while (uVar1 != uVar5);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != (uint)nvec);
    }
    else {
      uVar4 = 0;
      do {
        if (0 < (int)uVar1) {
          lVar2 = *(long *)((long)X[uVar4]->content + 8);
          lVar3 = *(long *)((long)Z[uVar4]->content + 8);
          uVar5 = 0;
          do {
            *(double *)(lVar3 + uVar5 * 8) = c[uVar4] * *(double *)(lVar2 + uVar5 * 8);
            uVar5 = uVar5 + 1;
          } while (uVar1 != uVar5);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != (uint)nvec);
    }
  }
  return 0;
}

Assistant:

int N_VScaleVectorArray_Serial(int nvec, realtype* c, N_Vector* X, N_Vector* Z)
{
  int          i;
  sunindextype j, N;
  realtype*    xd=NULL;
  realtype*    zd=NULL;

  /* invalid number of vectors */
  if (nvec < 1) return(-1);

  /* should have called N_VScale */
  if (nvec == 1) {
    N_VScale_Serial(c[0], X[0], Z[0]);
    return(0);
  }

  /* get vector length */
  N = NV_LENGTH_S(Z[0]);

  /*
   * X[i] *= c[i]
   */
  if (X == Z) {
    for (i=0; i<nvec; i++) {
      xd = NV_DATA_S(X[i]);
      for (j=0; j<N; j++) {
        xd[j] *= c[i];
      }
    }
    return(0);
  }

  /*
   * Z[i] = c[i] * X[i]
   */
  for (i=0; i<nvec; i++) {
    xd = NV_DATA_S(X[i]);
    zd = NV_DATA_S(Z[i]);
    for (j=0; j<N; j++) {
      zd[j] = c[i] * xd[j];
    }
  }
  return(0);
}